

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

int cs::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char *pcVar1;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  
  pcVar1 = *(char **)src;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    cs_impl::any::clone((any *)src,(__fn *)src,in_RDX,in_ECX,in_R8);
    cs_impl::any::detach((any *)src);
    pcVar1 = *(char **)src;
  }
  else {
    *pcVar1 = '\0';
  }
  *(char **)dst = pcVar1;
  *(undefined8 *)src = 0;
  return (int)dst;
}

Assistant:

var copy(var val)
	{
		if (!val.is_rvalue()) {
			val.clone();
			val.detach();
		}
		else
			val.mark_as_rvalue(false);
		return val;
	}